

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunc
          (BlendMaskStateMachine *this,GLenum src,GLenum dst)

{
  size_type sVar1;
  reference pvVar2;
  uint local_1c;
  uint i;
  GLenum dst_local;
  GLenum src_local;
  BlendMaskStateMachine *this_local;
  
  (*this->gl->blendFunc)(src,dst);
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
            ::size(&this->state);
    if (sVar1 <= local_1c) break;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_1c);
    pvVar2->func_src_rgb = src;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_1c);
    pvVar2->func_src_a = src;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_1c);
    pvVar2->func_dst_rgb = dst;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_1c);
    pvVar2->func_dst_a = dst;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunc(glw::GLenum src, glw::GLenum dst)
{
	// all draw buffers
	gl.blendFunc(src, dst);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].func_src_rgb = src;
		state[i].func_src_a   = src;
		state[i].func_dst_rgb = dst;
		state[i].func_dst_a   = dst;
	}
}